

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  Module *this;
  Signal *this_00;
  initializer_list<VcdGen::Signal_*> __l;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_00;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_01;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_02;
  initializer_list<std::tuple<unsigned_long,_unsigned_int>_> __l_03;
  undefined1 local_3c8 [8];
  VcdGenerator gen;
  Signal data;
  Signal valid;
  Signal wr_en;
  Module Logic;
  Module SubMod;
  Signal dummy;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  _Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> local_a0;
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_88;
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_70;
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_58;
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  local_40;
  allocator_type local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"test_001.vcd",
             (allocator<char> *)(wr_en.encoded_name_.field_2._M_local_buf + 8));
  VcdGen::VcdGenerator::VcdGenerator((VcdGenerator *)local_3c8,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"Logic",
             (allocator<char> *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  VcdGen::Module::Module((Module *)((long)&wr_en.encoded_name_.field_2 + 8),&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"SubMod",
             (allocator<char> *)(gen.vcd_data_.field_2._M_local_buf + 8));
  VcdGen::Module::Module
            ((Module *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  this = (Module *)(&wr_en.encoded_name_.field_2._M_allocated_capacity + 1);
  VcdGen::Module::add_submodule
            (this,(Module *)
                  &Logic.sub_modules_.
                   super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  gen.filename_.field_2._8_8_ = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"data",
             (allocator<char> *)(data.encoded_name_.field_2._M_local_buf + 8));
  this_00 = (Signal *)(&gen.vcd_data_.field_2._M_allocated_capacity + 1);
  VcdGen::Signal::Signal(this_00,&local_120,8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"valid",
             (allocator<char> *)(valid.encoded_name_.field_2._M_local_buf + 8));
  VcdGen::Signal::Signal((Signal *)((long)&data.encoded_name_.field_2 + 8),&local_100,1);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"wr_en",
             (allocator<char> *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  VcdGen::Signal::Signal((Signal *)((long)&valid.encoded_name_.field_2 + 8),&local_e0,1);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"dummy",
             (allocator<char> *)(dummy.encoded_name_.field_2._M_local_buf + 8));
  VcdGen::Signal::Signal
            ((Signal *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_c0,0x10);
  std::__cxx11::string::~string((string *)&local_c0);
  __l._M_len = 3;
  __l._M_array = (iterator)((long)&dummy.encoded_name_.field_2 + 8);
  dummy.encoded_name_.field_2._8_8_ = this_00;
  std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::vector
            ((vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> *)&local_a0,__l,&local_21)
  ;
  VcdGen::Module::add_signal
            ((Module *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> *)&local_a0);
  std::_Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::~_Vector_base(&local_a0);
  VcdGen::Module::add_signal
            ((Module *)((long)&wr_en.encoded_name_.field_2 + 8),
             (Signal *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  dummy.encoded_name_.field_2._8_8_ = dummy.encoded_name_.field_2._8_8_ & 0xffffffff00000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)((long)&dummy.encoded_name_.field_2 + 8);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
            *)&local_88,__l_00,(allocator_type *)&local_21);
  VcdGen::Signal::value_at
            ((Signal *)((long)&gen.vcd_data_.field_2 + 8),
             (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
              *)&local_88);
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~_Vector_base(&local_88);
  dummy.encoded_name_.field_2._8_8_ = dummy.encoded_name_.field_2._8_8_ & 0xffffffff00000000;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)((long)&dummy.encoded_name_.field_2 + 8);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
            *)&local_70,__l_01,(allocator_type *)&local_21);
  VcdGen::Signal::value_at
            ((Signal *)((long)&data.encoded_name_.field_2 + 8),
             (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
              *)&local_70);
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~_Vector_base(&local_70);
  dummy.encoded_name_.field_2._8_8_ = dummy.encoded_name_.field_2._8_8_ & 0xffffffff00000000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)((long)&dummy.encoded_name_.field_2 + 8);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
            *)&local_58,__l_02,(allocator_type *)&local_21);
  VcdGen::Signal::value_at
            ((Signal *)((long)&valid.encoded_name_.field_2 + 8),
             (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
              *)&local_58);
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~_Vector_base(&local_58);
  dummy.encoded_name_.field_2._8_8_ = dummy.encoded_name_.field_2._8_8_ & 0xffffffff00000000;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)((long)&dummy.encoded_name_.field_2 + 8);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
            *)&local_40,__l_03,(allocator_type *)&local_21);
  VcdGen::Signal::value_at
            ((Signal *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
              *)&local_40);
  std::
  _Vector_base<std::tuple<unsigned_long,_unsigned_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_int>_>_>
  ::~_Vector_base(&local_40);
  VcdGen::VcdGenerator::operator()((VcdGenerator *)local_3c8);
  VcdGen::Signal::~Signal
            ((Signal *)
             &SubMod.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  VcdGen::Signal::~Signal((Signal *)((long)&valid.encoded_name_.field_2 + 8));
  VcdGen::Signal::~Signal((Signal *)((long)&data.encoded_name_.field_2 + 8));
  VcdGen::Signal::~Signal((Signal *)((long)&gen.vcd_data_.field_2 + 8));
  VcdGen::Module::~Module
            ((Module *)
             &Logic.sub_modules_.
              super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  VcdGen::Module::~Module((Module *)((long)&wr_en.encoded_name_.field_2 + 8));
  VcdGen::VcdGenerator::~VcdGenerator((VcdGenerator *)local_3c8);
  return 0;
}

Assistant:

int main()
{

    // Single instance which generates the VCD
    VcdGen::VcdGenerator gen("test_001.vcd");

    // Hierachy contains modules
    VcdGen::Module Logic {"Logic"};
    VcdGen::Module SubMod {"SubMod"};

    // Modules can be heirarchical
    Logic.add_submodule( &SubMod ) ;

    // Connect things up
    gen.set_top_level_module( &Logic );
    
    // Create Signals : format Signal var{Name, Width};
    VcdGen::Signal data  { "data"  , 8  };
    VcdGen::Signal valid { "valid" , 1  };
    VcdGen::Signal wr_en { "wr_en" , 1  };
    VcdGen::Signal dummy { "dummy" , 16 };

    // Add Signals to the module / submodule
    SubMod.add_signal( {&data, &valid, &wr_en} );
    Logic.add_signal( &dummy );

    // Set values for the signals
    data.value_at(  {{0, 0}, {100, 85}, {110, 0}, {150, 0}} );
    valid.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    wr_en.value_at( {{0, 0}, {100, 1} , {110, 0}, {150, 0}} );
    dummy.value_at( {{0, 0}, {100, 11}, {110, 0}, {150, 0}} );
    
    gen();
}